

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

bool Random_SanityCheck(void)

{
  uchar *puVar1;
  uchar *data_00;
  long in_FS_OFFSET;
  int x_1;
  int x;
  int tries;
  int num_overwritten;
  uint64_t stop;
  uint64_t start;
  CSHA512 to_add;
  bool overwritten [32];
  uint8_t data [32];
  undefined2 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffeba;
  undefined1 in_stack_fffffffffffffebb;
  int in_stack_fffffffffffffebc;
  int local_140;
  int local_13c;
  int iVar2;
  undefined4 in_stack_fffffffffffffecc;
  bool bVar3;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 uVar4;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  CSHA512 *in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff08;
  uchar *in_stack_ffffffffffffff10;
  RNGState *in_stack_ffffffffffffff18;
  byte local_48 [32];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = (uchar *)anon_unknown.dwarf_f7a406::GetPerformanceCounter();
  memset(local_48,0,0x20);
  local_13c = 0;
  do {
    memset(local_28,0,0x20);
    anon_unknown.dwarf_f7a406::GetOSRand
              ((uchar *)CONCAT44(in_stack_fffffffffffffebc,
                                 CONCAT13(in_stack_fffffffffffffebb,
                                          CONCAT12(in_stack_fffffffffffffeba,
                                                   in_stack_fffffffffffffeb8))));
    for (local_140 = 0; local_140 < 0x20; local_140 = local_140 + 1) {
      local_48[local_140] = (local_48[local_140] & 1) != 0 || local_28[local_140] != '\0';
    }
    iVar2 = 0;
    for (in_stack_fffffffffffffebc = 0; in_stack_fffffffffffffebc < 0x20;
        in_stack_fffffffffffffebc = in_stack_fffffffffffffebc + 1) {
      if ((local_48[in_stack_fffffffffffffebc] & 1) != 0) {
        iVar2 = iVar2 + 1;
      }
    }
    local_13c = local_13c + 1;
    in_stack_fffffffffffffebb = iVar2 < 0x20 && local_13c < 0x400;
  } while ((bool)in_stack_fffffffffffffebb);
  if (iVar2 == 0x20) {
    uVar4 = 1;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,_std::ratio<1L,_1000L>_> *)
               CONCAT44(in_stack_fffffffffffffebc,
                        CONCAT13(in_stack_fffffffffffffebb,
                                 CONCAT12(in_stack_fffffffffffffeba,in_stack_fffffffffffffeb8))),
               (int *)0x88cce6);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(in_stack_fffffffffffffed0);
    data_00 = (uchar *)anon_unknown.dwarf_f7a406::GetPerformanceCounter();
    if (data_00 == puVar1) {
      bVar3 = false;
    }
    else {
      CSHA512::CSHA512((CSHA512 *)
                       CONCAT44(in_stack_fffffffffffffebc,
                                CONCAT13(in_stack_fffffffffffffebb,
                                         CONCAT12(in_stack_fffffffffffffeba,
                                                  in_stack_fffffffffffffeb8))));
      CSHA512::Write((CSHA512 *)CONCAT44(uVar4,in_stack_fffffffffffffed8),data_00,
                     CONCAT44(in_stack_fffffffffffffecc,iVar2));
      CSHA512::Write((CSHA512 *)CONCAT44(uVar4,in_stack_fffffffffffffed8),data_00,
                     CONCAT44(in_stack_fffffffffffffecc,iVar2));
      anon_unknown.dwarf_f7a406::GetRNGState();
      anon_unknown.dwarf_f7a406::RNGState::MixExtract
                (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                 in_stack_ffffffffffffff00,(bool)in_stack_fffffffffffffeff,
                 (bool)in_stack_fffffffffffffefe);
      bVar3 = true;
    }
  }
  else {
    bVar3 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool Random_SanityCheck()
{
    uint64_t start = GetPerformanceCounter();

    /* This does not measure the quality of randomness, but it does test that
     * GetOSRand() overwrites all 32 bytes of the output given a maximum
     * number of tries.
     */
    static constexpr int MAX_TRIES{1024};
    uint8_t data[NUM_OS_RANDOM_BYTES];
    bool overwritten[NUM_OS_RANDOM_BYTES] = {}; /* Tracks which bytes have been overwritten at least once */
    int num_overwritten;
    int tries = 0;
    /* Loop until all bytes have been overwritten at least once, or max number tries reached */
    do {
        memset(data, 0, NUM_OS_RANDOM_BYTES);
        GetOSRand(data);
        for (int x=0; x < NUM_OS_RANDOM_BYTES; ++x) {
            overwritten[x] |= (data[x] != 0);
        }

        num_overwritten = 0;
        for (int x=0; x < NUM_OS_RANDOM_BYTES; ++x) {
            if (overwritten[x]) {
                num_overwritten += 1;
            }
        }

        tries += 1;
    } while (num_overwritten < NUM_OS_RANDOM_BYTES && tries < MAX_TRIES);
    if (num_overwritten != NUM_OS_RANDOM_BYTES) return false; /* If this failed, bailed out after too many tries */

    // Check that GetPerformanceCounter increases at least during a GetOSRand() call + 1ms sleep.
    std::this_thread::sleep_for(std::chrono::milliseconds(1));
    uint64_t stop = GetPerformanceCounter();
    if (stop == start) return false;

    // We called GetPerformanceCounter. Use it as entropy.
    CSHA512 to_add;
    to_add.Write((const unsigned char*)&start, sizeof(start));
    to_add.Write((const unsigned char*)&stop, sizeof(stop));
    GetRNGState().MixExtract(nullptr, 0, std::move(to_add), false, /*always_use_real_rng=*/true);

    return true;
}